

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall
ktxApp::processCommandLine
          (ktxApp *this,int argc,char **argv,StdinUse stdinStat,OutfilePos outfilePos)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  pointer pbVar6;
  ulong uVar7;
  int in_ECX;
  undefined8 *in_RDX;
  uint in_ESI;
  ktxApp *in_RDI;
  int in_R8D;
  const_iterator it;
  uint32_t infileCount;
  argparser parser;
  size_t dot;
  size_t slash;
  uint32_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001020;
  undefined1 in_stack_0000102f;
  string *in_stack_00001030;
  ktxApp *in_stack_00001038;
  value_type *in_stack_fffffffffffffec8;
  commandOptions *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  char **in_stack_fffffffffffffee0;
  commandOptions *this_00;
  int in_stack_fffffffffffffeec;
  argparser *in_stack_fffffffffffffef0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  uint local_88;
  undefined1 local_78 [16];
  uint local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  ulong local_38;
  long local_30;
  uint local_24;
  int local_20;
  int local_1c;
  uint local_c;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_c = in_ESI;
  std::__cxx11::string::operator=((string *)&in_RDI->name,(char *)*in_RDX);
  cVar1 = (char)in_RDI;
  local_30 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x5c);
  if (local_30 == -1) {
    local_30 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x2f);
  }
  if (local_30 != -1) {
    std::__cxx11::string::erase((ulong)&in_RDI->name,0);
  }
  local_38 = std::__cxx11::string::find_last_of(cVar1 + '\b',0x2e);
  if (local_38 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)&in_RDI->name,local_38);
  }
  argparser::argparser
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  (*in_RDI->_vptr_ktxApp[2])(in_RDI,local_78);
  local_24 = local_58;
  if (local_c != local_58) {
    if (local_20 == 1) {
      local_24 = local_58 + 1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_50,(ulong)local_58);
      std::__cxx11::string::operator=((string *)&in_RDI->options->outfile,(string *)pvVar4);
    }
    in_stack_ffffffffffffff14 = local_c;
    local_88 = local_c;
    if (local_20 == 2) {
      local_88 = local_c - 1;
      in_stack_ffffffffffffff14 = local_88;
    }
    for (; local_24 < local_88; local_24 = local_24 + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_50,(ulong)local_24);
      in_stack_ffffffffffffff08 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
      if (*in_stack_ffffffffffffff08 == '@') {
        this_01 = &local_50;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](this_01,(ulong)local_24);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_01,(ulong)local_24);
        in_stack_ffffffffffffff00 =
             (allocator<char> *)std::__cxx11::string::operator[]((ulong)pvVar4);
        bVar2 = loadFileList(in_stack_00001038,in_stack_00001030,(bool)in_stack_0000102f,
                             in_stack_00001020);
        if (!bVar2) {
          exit(1);
        }
      }
      else {
        this_00 = in_RDI->options;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_50,(ulong)local_24);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->infiles,in_stack_fffffffffffffed8);
      }
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&in_RDI->options->infiles);
    if (1 < sVar5) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_90);
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffec8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffed0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffec8);
      local_90._M_current = local_98;
      while( true ) {
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffec8);
        bVar2 = __gnu_cxx::operator<
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffed0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffec8);
        if (!bVar2) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_90);
        iVar3 = std::__cxx11::string::compare((char *)pbVar6);
        if (iVar3 == 0) {
          error(in_RDI,"cannot use stdin as one among many inputs.");
          (*in_RDI->_vptr_ktxApp[1])();
          exit(1);
        }
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffed8,
                                (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      }
    }
    if (local_20 == 2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_50,(ulong)local_24);
      std::__cxx11::string::operator=((string *)&in_RDI->options->outfile,(string *)pvVar4);
    }
  }
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->options->infiles);
  if (sVar5 == 0) {
    if (local_1c != 1) {
      error(in_RDI,"need some input files.");
      (*in_RDI->_vptr_ktxApp[1])();
      exit(1);
    }
    in_stack_fffffffffffffed0 = in_RDI->options;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&in_stack_fffffffffffffed0->infiles,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  if ((local_20 != 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
    error(in_RDI,"need an output file");
  }
  argparser::~argparser((argparser *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

void processCommandLine(int argc, char* argv[],
                            StdinUse stdinStat = eAllowStdin,
                            OutfilePos outfilePos = eNone)
    {
        uint32_t i;
        size_t slash, dot;

        name = argv[0];
        // For consistent Id, only use the stem of name;
        slash = name.find_last_of('\\');
        if (slash == string::npos)
            slash = name.find_last_of('/');
        if (slash != string::npos)
            name.erase(0, slash+1);  // Remove directory name.
        dot = name.find_last_of('.');
            if (dot != string::npos)
                name.erase(dot, string::npos); // Remove extension.

        argparser parser(argc, argv);
        processOptions(parser);

        i = parser.optind;
        if (argc - i > 0) {
            if (outfilePos == eFirst)
                options.outfile = parser.argv[i++];
            uint32_t infileCount = outfilePos == eLast ? argc - 1 : argc;
            for (; i < infileCount; i++) {
                if (parser.argv[i][0] == '@') {
                    if (!loadFileList(parser.argv[i],
                                      parser.argv[i][1] == '@',
                                      options.infiles)) {
                        exit(1);
                    }
                } else {
                    options.infiles.push_back(parser.argv[i]);
                }
            }
            if (options.infiles.size() > 1) {
                std::vector<string>::const_iterator it;
                for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
                    if (it->compare("-") == 0) {
                        error("cannot use stdin as one among many inputs.");
                        usage();
                        exit(1);
                    }
                }
            }
            if (outfilePos == eLast)
                options.outfile = parser.argv[i];
        }

        if (options.infiles.size() == 0) {
            if (stdinStat == eAllowStdin) {
                options.infiles.push_back("-"); // Use stdin as 0 files.
            } else {
                error("need some input files.");
                usage();
                exit(1);
            }
        }
        if (outfilePos != eNone && options.outfile.empty()) {
            error("need an output file");
        }
    }